

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64(CodedInputStream *this,uint64 *value)

{
  uint8 *puVar1;
  bool bVar2;
  
  puVar1 = this->buffer_;
  if ((puVar1 < this->buffer_end_) && (-1 < (long)(char)*puVar1)) {
    *value = (long)(char)*puVar1;
    this->buffer_ = puVar1 + 1;
    return true;
  }
  bVar2 = ReadVarint64Fallback(this,value);
  return bVar2;
}

Assistant:

inline bool CodedInputStream::ReadVarint64(uint64* value) {
  if (GOOGLE_PREDICT_TRUE(buffer_ < buffer_end_) && *buffer_ < 0x80) {
    *value = *buffer_;
    Advance(1);
    return true;
  } else {
    return ReadVarint64Fallback(value);
  }
}